

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglplatformcontext.cpp
# Opt level: O1

void __thiscall
QEGLPlatformContext::swapBuffers(QEGLPlatformContext *this,QPlatformSurface *surface)

{
  int iVar1;
  undefined4 extraout_var;
  
  eglBindAPI(this->m_api);
  iVar1 = (*(this->super_QPlatformOpenGLContext)._vptr_QPlatformOpenGLContext[0x11])(this,surface);
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar1 = eglSwapBuffers(this->m_eglDisplay,CONCAT44(extraout_var,iVar1));
    if (iVar1 == 0) {
      swapBuffers();
    }
  }
  return;
}

Assistant:

void QEGLPlatformContext::swapBuffers(QPlatformSurface *surface)
{
    eglBindAPI(m_api);
    EGLSurface eglSurface = eglSurfaceForPlatformSurface(surface);
    if (eglSurface != EGL_NO_SURFACE) { // skip if using surfaceless context
        bool ok = eglSwapBuffers(m_eglDisplay, eglSurface);
        if (!ok)
            qWarning("QEGLPlatformContext: eglSwapBuffers failed: %x", eglGetError());
    }
}